

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_vertical_14_dual_sse2
               (uint16_t *s,int pitch,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,
               uint8_t *blimit1,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  uint16_t *puVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ushort uVar10;
  ushort uVar13;
  ushort uVar14;
  ulong uVar11;
  ushort uVar15;
  ushort uVar16;
  ushort uVar18;
  ushort uVar19;
  ulong uVar17;
  undefined1 auVar12 [16];
  ushort uVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  ushort uVar24;
  short sVar27;
  short sVar28;
  short sVar29;
  ushort uVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  ushort uVar34;
  ulong uVar25;
  short sVar35;
  short sVar36;
  short sVar37;
  ushort uVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  ushort uVar42;
  short sVar44;
  short sVar45;
  short sVar46;
  ushort uVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  ushort uVar51;
  ulong uVar43;
  undefined1 auVar26 [16];
  short sVar52;
  short sVar53;
  short sVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  __m128i d5_out;
  ushort local_4c8;
  ushort uStack_4c6;
  ushort uStack_4c4;
  ushort uStack_4c2;
  ushort uStack_4c0;
  ushort uStack_4be;
  ushort uStack_4bc;
  ushort uStack_4ba;
  ushort local_4b8;
  ushort uStack_4b6;
  ushort uStack_4b4;
  ushort uStack_4b2;
  ushort uStack_4b0;
  ushort uStack_4ae;
  ushort uStack_4ac;
  ushort uStack_4aa;
  __m128i d4_out;
  __m128i d7_out;
  __m128i d6_out;
  undefined8 local_468;
  undefined8 uStack_460;
  short local_458;
  short sStack_456;
  short sStack_454;
  short sStack_452;
  short sStack_450;
  short sStack_44e;
  short sStack_44c;
  short sStack_44a;
  ushort local_448;
  ushort uStack_446;
  ushort uStack_444;
  ushort uStack_442;
  ushort uStack_440;
  ushort uStack_43e;
  ushort uStack_43c;
  ushort uStack_43a;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_430;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  short local_418;
  short sStack_416;
  short sStack_414;
  short sStack_412;
  short sStack_410;
  short sStack_40e;
  short sStack_40c;
  short sStack_40a;
  __m128i local_408;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  short sStack_3e0;
  short sStack_3de;
  short sStack_3dc;
  short sStack_3da;
  ushort local_3d8;
  ushort uStack_3d6;
  ushort uStack_3d4;
  ushort uStack_3d2;
  ushort uStack_3d0;
  ushort uStack_3ce;
  ushort uStack_3cc;
  ushort uStack_3ca;
  short local_3c8;
  short sStack_3c6;
  short sStack_3c4;
  short sStack_3c2;
  short sStack_3c0;
  short sStack_3be;
  short sStack_3bc;
  short sStack_3ba;
  short local_3b8;
  short sStack_3b6;
  short sStack_3b4;
  short sStack_3b2;
  short sStack_3b0;
  short sStack_3ae;
  short sStack_3ac;
  short sStack_3aa;
  short local_3a8;
  short sStack_3a6;
  short sStack_3a4;
  short sStack_3a2;
  short sStack_3a0;
  short sStack_39e;
  short sStack_39c;
  short sStack_39a;
  __m128i local_398;
  uint8_t *local_388;
  short sStack_380;
  short sStack_37e;
  short sStack_37c;
  short sStack_37a;
  uint16_t *local_370;
  long local_368;
  long local_360;
  __m128i d3_out;
  __m128i d2_out;
  __m128i d7;
  __m128i d0;
  __m128i p0_2;
  __m128i q0;
  __m128i p0;
  __m128i t80;
  __m128i thresh;
  __m128i d1_out;
  __m128i d0_out;
  __m128i q0_2;
  __m128i p1_2;
  __m128i p2_2;
  __m128i p3_2;
  __m128i p4_2;
  __m128i p5_2;
  __m128i p6_2;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m128i p4;
  __m128i p5;
  __m128i p6;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  __m128i mask;
  
  p6[0] = *(longlong *)(s + -8);
  p6[1] = *(longlong *)(s + -4);
  lVar7 = (long)pitch;
  p5[0] = *(longlong *)(s + lVar7 + -8);
  p5[1] = *(longlong *)(s + lVar7 + -8 + 4);
  lVar3 = (long)(pitch * 2);
  p4[0] = *(longlong *)(s + lVar3 + -8);
  p4[1] = *(longlong *)(s + lVar3 + -8 + 4);
  lVar4 = (long)(pitch * 3);
  p3[0] = *(longlong *)(s + lVar4 + -8);
  p3[1] = *(longlong *)(s + lVar4 + -8 + 4);
  lVar5 = (long)(pitch * 4);
  p2[0] = *(longlong *)(s + lVar5 + -8);
  p2[1] = *(longlong *)(s + lVar5 + -8 + 4);
  lVar6 = (long)(pitch * 5);
  p1[0] = *(longlong *)(s + lVar6 + -8);
  p1[1] = *(longlong *)(s + lVar6 + -8 + 4);
  lVar9 = (long)(pitch * 6);
  p0[0] = *(longlong *)(s + lVar9 + -8);
  p0[1] = *(longlong *)(s + lVar9 + -8 + 4);
  lVar8 = (long)(pitch * 7);
  q0[0] = *(longlong *)(s + lVar8 + -8);
  q0[1] = *(longlong *)(s + lVar8 + -8 + 4);
  local_388 = blimit0;
  highbd_transpose8x8_sse2
            (&p6,&p5,&p4,&p3,&p2,&p1,&p0,&q0,&d0,&local_408,(__m128i *)&local_418,
             (__m128i *)&local_428,(__m128i *)&local_438,(__m128i *)&local_448,(__m128i *)&local_458
             ,(__m128i *)&local_468);
  p6_2[0] = *(longlong *)s;
  p6_2[1] = *(longlong *)(s + 4);
  p5_2[0] = *(longlong *)(s + lVar7);
  p5_2[1] = *(longlong *)(s + lVar7 + 4);
  p4_2[0] = *(longlong *)(s + lVar3);
  p4_2[1] = *(longlong *)(s + lVar3 + 4);
  p3_2[0] = *(longlong *)(s + lVar4);
  p3_2[1] = *(longlong *)(s + lVar4 + 4);
  p2_2[0] = *(longlong *)(s + lVar5);
  p2_2[1] = *(longlong *)(s + lVar5 + 4);
  p1_2[0] = *(longlong *)(s + lVar6);
  p1_2[1] = *(longlong *)(s + lVar6 + 4);
  p0_2[0] = *(longlong *)(s + lVar9);
  p0_2[1] = *(longlong *)(s + lVar9 + 4);
  q0_2[0] = *(longlong *)(s + lVar8);
  q0_2[1] = *(longlong *)(s + lVar8 + 4);
  local_370 = s;
  local_368 = lVar5;
  local_360 = lVar7;
  highbd_transpose8x8_sse2
            (&p6_2,&p5_2,&p4_2,&p3_2,&p2_2,&p1_2,&p0_2,&q0_2,(__m128i *)&local_3f8,
             (__m128i *)&local_3e8,(__m128i *)&local_3d8,(__m128i *)&local_3c8,(__m128i *)&local_3b8
             ,(__m128i *)&local_3a8,&local_398,&d7);
  get_limit_dual(local_388,limit0,thresh0,blimit1,limit1,thresh1,bd,&d6_out,&d7_out,&thresh,&t80);
  highbd_filter_mask_dual((__m128i *)&local_468,(__m128i *)&local_3f8,&d7_out,&d6_out,&mask);
  highbd_flat_mask4_dual_sse2
            ((__m128i *)&local_468,(__m128i *)&local_3f8,(__m128i *)&local_58,(__m128i *)&local_68,
             bd);
  uVar25 = mask[0] & local_58;
  uVar43 = mask[1] & uStack_50;
  uVar11 = local_68 & uVar25;
  uVar17 = uStack_60 & uVar43;
  highbd_filter4_dual_sse2
            ((__m128i *)&local_468,(__m128i *)&local_3f8,&d4_out,&d5_out,&mask,&thresh,bd,&t80);
  local_4b8 = (ushort)uVar25;
  uStack_4b6 = (ushort)(uVar25 >> 0x10);
  uStack_4b4 = (ushort)(uVar25 >> 0x20);
  uStack_4b2 = (ushort)(uVar25 >> 0x30);
  uStack_4b0 = (ushort)uVar43;
  uStack_4ae = (ushort)(uVar43 >> 0x10);
  uStack_4ac = (ushort)(uVar43 >> 0x20);
  uStack_4aa = (ushort)(uVar43 >> 0x30);
  auVar26._0_2_ = -(ushort)(local_4b8 == 0);
  auVar26._2_2_ = -(ushort)(uStack_4b6 == 0);
  auVar26._4_2_ = -(ushort)(uStack_4b4 == 0);
  auVar26._6_2_ = -(ushort)(uStack_4b2 == 0);
  auVar26._8_2_ = -(ushort)(uStack_4b0 == 0);
  auVar26._10_2_ = -(ushort)(uStack_4ae == 0);
  auVar26._12_2_ = -(ushort)(uStack_4ac == 0);
  auVar26._14_2_ = -(ushort)(uStack_4aa == 0);
  if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar26._14_2_ >> 7) & 1) << 0xe | auVar26._14_2_ & 0x8000) == 0xffff
     ) {
    local_468 = d4_out[0];
    uStack_460 = d4_out[1];
    local_3f8 = d5_out[0];
    uStack_3f0 = d5_out[1];
  }
  else {
    sVar64 = (short)local_3e8 + (short)local_3f8 + local_3d8 +
             local_458 + (short)local_468 + local_448;
    sVar65 = local_3e8._2_2_ + local_3f8._2_2_ + uStack_3d6 +
             sStack_456 + local_468._2_2_ + uStack_446;
    sVar66 = local_3e8._4_2_ + local_3f8._4_2_ + uStack_3d4 +
             sStack_454 + local_468._4_2_ + uStack_444;
    sVar67 = local_3e8._6_2_ + local_3f8._6_2_ + uStack_3d2 +
             sStack_452 + local_468._6_2_ + uStack_442;
    sVar68 = sStack_3e0 + (short)uStack_3f0 + uStack_3d0 +
             sStack_450 + (short)uStack_460 + uStack_440;
    sVar69 = sStack_3de + uStack_3f0._2_2_ + uStack_3ce + sStack_44e + uStack_460._2_2_ + uStack_43e
    ;
    sVar70 = sStack_3dc + uStack_3f0._4_2_ + uStack_3cc + sStack_44c + uStack_460._4_2_ + uStack_43c
    ;
    sVar71 = sStack_3da + uStack_3f0._6_2_ + uStack_3ca + sStack_44a + uStack_460._6_2_ + uStack_43a
    ;
    sVar21 = sVar64 + 4;
    sVar27 = sVar65 + 4;
    sVar31 = sVar66 + 4;
    sVar35 = sVar67 + 4;
    sVar39 = sVar68 + 4;
    sVar44 = sVar69 + 4;
    sVar48 = sVar70 + 4;
    sVar52 = sVar71 + 4;
    d2_out[0]._0_2_ = (ushort)((short)local_468 + local_438 + sVar21) >> 3;
    d2_out[0]._2_2_ = (ushort)(local_468._2_2_ + sStack_436 + sVar27) >> 3;
    d2_out[0]._4_2_ = (ushort)(local_468._4_2_ + sStack_434 + sVar31) >> 3;
    d2_out[0]._6_2_ = (ushort)(local_468._6_2_ + sStack_432 + sVar35) >> 3;
    d2_out[1]._0_2_ = (ushort)((short)uStack_460 + sStack_430 + sVar39) >> 3;
    d2_out[1]._2_2_ = (ushort)(uStack_460._2_2_ + sStack_42e + sVar44) >> 3;
    d2_out[1]._4_2_ = (ushort)(uStack_460._4_2_ + sStack_42c + sVar48) >> 3;
    d2_out[1]._6_2_ = (ushort)(uStack_460._6_2_ + sStack_42a + sVar52) >> 3;
    d3_out[0]._0_2_ = (ushort)((short)local_3f8 + local_3c8 + sVar21) >> 3;
    d3_out[0]._2_2_ = (ushort)(local_3f8._2_2_ + sStack_3c6 + sVar27) >> 3;
    d3_out[0]._4_2_ = (ushort)(local_3f8._4_2_ + sStack_3c4 + sVar31) >> 3;
    d3_out[0]._6_2_ = (ushort)(local_3f8._6_2_ + sStack_3c2 + sVar35) >> 3;
    d3_out[1]._0_2_ = (ushort)((short)uStack_3f0 + sStack_3c0 + sVar39) >> 3;
    d3_out[1]._2_2_ = (ushort)(uStack_3f0._2_2_ + sStack_3be + sVar44) >> 3;
    d3_out[1]._4_2_ = (ushort)(uStack_3f0._4_2_ + sStack_3bc + sVar48) >> 3;
    d3_out[1]._6_2_ = (ushort)(uStack_3f0._6_2_ + sStack_3ba + sVar52) >> 3;
    sVar22 = sVar21 - local_3d8;
    sVar28 = sVar27 - uStack_3d6;
    sVar32 = sVar31 - uStack_3d4;
    sVar36 = sVar35 - uStack_3d2;
    sVar40 = sVar39 - uStack_3d0;
    sVar45 = sVar44 - uStack_3ce;
    sVar49 = sVar48 - uStack_3cc;
    sVar53 = sVar52 - uStack_3ca;
    sVar21 = sVar21 - local_448;
    sVar27 = sVar27 - uStack_446;
    sVar31 = sVar31 - uStack_444;
    sVar35 = sVar35 - uStack_442;
    sVar39 = sVar39 - uStack_440;
    sVar44 = sVar44 - uStack_43e;
    sVar48 = sVar48 - uStack_43c;
    sVar52 = sVar52 - uStack_43a;
    sVar72 = local_438 * 3 + local_448;
    sVar73 = sStack_436 * 3 + uStack_446;
    sVar74 = sStack_434 * 3 + uStack_444;
    sVar75 = sStack_432 * 3 + uStack_442;
    sVar76 = sStack_430 * 3 + uStack_440;
    sVar77 = sStack_42e * 3 + uStack_43e;
    sVar78 = sStack_42c * 3 + uStack_43c;
    sVar79 = sStack_42a * 3 + uStack_43a;
    local_388 = local_3e8;
    sStack_380 = sStack_3e0;
    sStack_37e = sStack_3de;
    sStack_37c = sStack_3dc;
    sStack_37a = sStack_3da;
    sVar23 = (local_3c8 * 3 - local_458) + local_3d8;
    sVar29 = (sStack_3c6 * 3 - sStack_456) + uStack_3d6;
    sVar33 = (sStack_3c4 * 3 - sStack_454) + uStack_3d4;
    sVar37 = (sStack_3c2 * 3 - sStack_452) + uStack_3d2;
    sVar41 = (sStack_3c0 * 3 - sStack_450) + uStack_3d0;
    sVar46 = (sStack_3be * 3 - sStack_44e) + uStack_3ce;
    sVar50 = (sStack_3bc * 3 - sStack_44c) + uStack_3cc;
    sVar54 = (sStack_3ba * 3 - sStack_44a) + uStack_3ca;
    local_4c8 = (ushort)uVar11;
    uStack_4c6 = (ushort)(uVar11 >> 0x10);
    uStack_4c4 = (ushort)(uVar11 >> 0x20);
    uStack_4c2 = (ushort)(uVar11 >> 0x30);
    uStack_4c0 = (ushort)uVar17;
    uStack_4be = (ushort)(uVar17 >> 0x10);
    uStack_4bc = (ushort)(uVar17 >> 0x20);
    uStack_4ba = (ushort)(uVar17 >> 0x30);
    auVar12._0_2_ = -(ushort)(local_4c8 == 0);
    auVar12._2_2_ = -(ushort)(uStack_4c6 == 0);
    auVar12._4_2_ = -(ushort)(uStack_4c4 == 0);
    auVar12._6_2_ = -(ushort)(uStack_4c2 == 0);
    auVar12._8_2_ = -(ushort)(uStack_4c0 == 0);
    auVar12._10_2_ = -(ushort)(uStack_4be == 0);
    auVar12._12_2_ = -(ushort)(uStack_4bc == 0);
    auVar12._14_2_ = -(ushort)(uStack_4ba == 0);
    uVar2 = ((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
             (ushort)((byte)(auVar12._14_2_ >> 7) & 1) << 0xe | auVar12._14_2_ & 0x8000) ^ 0xffff;
    if (uVar2 != 0) {
      sVar64 = local_428 + local_418 + local_438 + local_3a8 + local_3b8 + local_3c8 + sVar64 + 8;
      sVar65 = sStack_426 + sStack_416 + sStack_436 + sStack_3a6 + sStack_3b6 + sStack_3c6 + sVar65
               + 8;
      sVar66 = sStack_424 + sStack_414 + sStack_434 + sStack_3a4 + sStack_3b4 + sStack_3c4 + sVar66
               + 8;
      sVar67 = sStack_422 + sStack_412 + sStack_432 + sStack_3a2 + sStack_3b2 + sStack_3c2 + sVar67
               + 8;
      sVar68 = sStack_420 + sStack_410 + sStack_430 + sStack_3a0 + sStack_3b0 + sStack_3c0 + sVar68
               + 8;
      sVar69 = sStack_41e + sStack_40e + sStack_42e + sStack_39e + sStack_3ae + sStack_3be + sVar69
               + 8;
      sVar70 = sStack_41c + sStack_40c + sStack_42c + sStack_39c + sStack_3ac + sStack_3bc + sVar70
               + 8;
      sVar71 = sStack_41a + sStack_40a + sStack_42a + sStack_39a + sStack_3aa + sStack_3ba + sVar71
               + 8;
      d0_out[0]._0_2_ =
           (ushort)(local_458 + (short)local_468 + (short)local_3f8 + (short)local_408[0] + sVar64)
           >> 4;
      d0_out[0]._2_2_ =
           (ushort)(sStack_456 + local_468._2_2_ + local_3f8._2_2_ + local_408[0]._2_2_ + sVar65) >>
           4;
      d0_out[0]._4_2_ =
           (ushort)(sStack_454 + local_468._4_2_ + local_3f8._4_2_ + local_408[0]._4_2_ + sVar66) >>
           4;
      d0_out[0]._6_2_ =
           (ushort)(sStack_452 + local_468._6_2_ + local_3f8._6_2_ + local_408[0]._6_2_ + sVar67) >>
           4;
      d0_out[1]._0_2_ =
           (ushort)(sStack_450 + (short)uStack_460 + (short)uStack_3f0 + (short)local_408[1] +
                   sVar68) >> 4;
      d0_out[1]._2_2_ =
           (ushort)(sStack_44e + uStack_460._2_2_ + uStack_3f0._2_2_ + local_408[1]._2_2_ + sVar69)
           >> 4;
      d0_out[1]._4_2_ =
           (ushort)(sStack_44c + uStack_460._4_2_ + uStack_3f0._4_2_ + local_408[1]._4_2_ + sVar70)
           >> 4;
      d0_out[1]._6_2_ =
           (ushort)(sStack_44a + uStack_460._6_2_ + uStack_3f0._6_2_ + local_408[1]._6_2_ + sVar71)
           >> 4;
      d1_out[0]._0_2_ =
           (ushort)((short)local_3e8 + (short)local_3f8 + (short)local_468 + (short)local_398[0] +
                   sVar64) >> 4;
      d1_out[0]._2_2_ =
           (ushort)(local_3e8._2_2_ + local_3f8._2_2_ + local_468._2_2_ + local_398[0]._2_2_ +
                   sVar65) >> 4;
      d1_out[0]._4_2_ =
           (ushort)(local_3e8._4_2_ + local_3f8._4_2_ + local_468._4_2_ + local_398[0]._4_2_ +
                   sVar66) >> 4;
      d1_out[0]._6_2_ =
           (ushort)(local_3e8._6_2_ + local_3f8._6_2_ + local_468._6_2_ + local_398[0]._6_2_ +
                   sVar67) >> 4;
      d1_out[1]._0_2_ =
           (ushort)(sStack_3e0 + (short)uStack_3f0 + (short)uStack_460 + (short)local_398[1] +
                   sVar68) >> 4;
      d1_out[1]._2_2_ =
           (ushort)(sStack_3de + uStack_3f0._2_2_ + uStack_460._2_2_ + local_398[1]._2_2_ + sVar69)
           >> 4;
      d1_out[1]._4_2_ =
           (ushort)(sStack_3dc + uStack_3f0._4_2_ + uStack_460._4_2_ + local_398[1]._4_2_ + sVar70)
           >> 4;
      d1_out[1]._6_2_ =
           (ushort)(sStack_3da + uStack_3f0._6_2_ + uStack_460._6_2_ + local_398[1]._6_2_ + sVar71)
           >> 4;
      psllw((undefined1  [16])local_408,2);
      psllw((undefined1  [16])local_398,2);
    }
    uVar10 = local_4b8 ^ 0xffff;
    uVar13 = uStack_4b6 ^ 0xffff;
    uVar14 = uStack_4b4 ^ 0xffff;
    uVar15 = uStack_4b2 ^ 0xffff;
    uVar16 = uStack_4b0 ^ 0xffff;
    uVar18 = uStack_4ae ^ 0xffff;
    uVar19 = uStack_4ac ^ 0xffff;
    uVar20 = uStack_4aa ^ 0xffff;
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 0x10) {
      uVar24 = *(ushort *)((long)d4_out + lVar5) & uVar10;
      uVar30 = *(ushort *)((long)d4_out + lVar5 + 2) & uVar13;
      uVar34 = *(ushort *)((long)d4_out + lVar5 + 4) & uVar14;
      uVar38 = *(ushort *)((long)d4_out + lVar5 + 6) & uVar15;
      uVar42 = *(ushort *)((long)d4_out + lVar5 + 8) & uVar16;
      uVar47 = *(ushort *)((long)d4_out + lVar5 + 10) & uVar18;
      uVar51 = *(ushort *)((long)d4_out + lVar5 + 0xc) & uVar19;
      uVar55 = *(ushort *)((long)d4_out + lVar5 + 0xe) & uVar20;
      *(ushort *)((long)d4_out + lVar5) = uVar24;
      *(ushort *)((long)d4_out + lVar5 + 2) = uVar30;
      *(ushort *)((long)d4_out + lVar5 + 4) = uVar34;
      *(ushort *)((long)d4_out + lVar5 + 6) = uVar38;
      *(ushort *)((long)d4_out + lVar5 + 8) = uVar42;
      *(ushort *)((long)d4_out + lVar5 + 10) = uVar47;
      *(ushort *)((long)d4_out + lVar5 + 0xc) = uVar51;
      *(ushort *)((long)d4_out + lVar5 + 0xe) = uVar55;
      uVar56 = *(ushort *)((long)d2_out + lVar5) & local_4b8;
      uVar57 = *(ushort *)((long)d2_out + lVar5 + 2) & uStack_4b6;
      uVar58 = *(ushort *)((long)d2_out + lVar5 + 4) & uStack_4b4;
      uVar59 = *(ushort *)((long)d2_out + lVar5 + 6) & uStack_4b2;
      uVar60 = *(ushort *)((long)d2_out + lVar5 + 8) & uStack_4b0;
      uVar61 = *(ushort *)((long)d2_out + lVar5 + 10) & uStack_4ae;
      uVar62 = *(ushort *)((long)d2_out + lVar5 + 0xc) & uStack_4ac;
      uVar63 = *(ushort *)((long)d2_out + lVar5 + 0xe) & uStack_4aa;
      *(ushort *)((long)d2_out + lVar5) = uVar56;
      *(ushort *)((long)d2_out + lVar5 + 2) = uVar57;
      *(ushort *)((long)d2_out + lVar5 + 4) = uVar58;
      *(ushort *)((long)d2_out + lVar5 + 6) = uVar59;
      *(ushort *)((long)d2_out + lVar5 + 8) = uVar60;
      *(ushort *)((long)d2_out + lVar5 + 10) = uVar61;
      *(ushort *)((long)d2_out + lVar5 + 0xc) = uVar62;
      *(ushort *)((long)d2_out + lVar5 + 0xe) = uVar63;
      *(ushort *)((long)&local_468 + lVar5) = uVar56 | uVar24;
      *(ushort *)((long)&local_468 + lVar5 + 2) = uVar57 | uVar30;
      *(ushort *)((long)&local_468 + lVar5 + 4) = uVar58 | uVar34;
      *(ushort *)((long)&local_468 + lVar5 + 6) = uVar59 | uVar38;
      *(ushort *)((long)&uStack_460 + lVar5) = uVar60 | uVar42;
      *(ushort *)((long)&uStack_460 + lVar5 + 2) = uVar61 | uVar47;
      *(ushort *)((long)&uStack_460 + lVar5 + 4) = uVar62 | uVar51;
      *(ushort *)((long)&uStack_460 + lVar5 + 6) = uVar63 | uVar55;
      uVar24 = *(ushort *)((long)d5_out + lVar5) & uVar10;
      uVar30 = *(ushort *)((long)d5_out + lVar5 + 2) & uVar13;
      uVar34 = *(ushort *)((long)d5_out + lVar5 + 4) & uVar14;
      uVar38 = *(ushort *)((long)d5_out + lVar5 + 6) & uVar15;
      uVar42 = *(ushort *)((long)d5_out + lVar5 + 8) & uVar16;
      uVar47 = *(ushort *)((long)d5_out + lVar5 + 10) & uVar18;
      uVar51 = *(ushort *)((long)d5_out + lVar5 + 0xc) & uVar19;
      uVar55 = *(ushort *)((long)d5_out + lVar5 + 0xe) & uVar20;
      *(ushort *)((long)d5_out + lVar5) = uVar24;
      *(ushort *)((long)d5_out + lVar5 + 2) = uVar30;
      *(ushort *)((long)d5_out + lVar5 + 4) = uVar34;
      *(ushort *)((long)d5_out + lVar5 + 6) = uVar38;
      *(ushort *)((long)d5_out + lVar5 + 8) = uVar42;
      *(ushort *)((long)d5_out + lVar5 + 10) = uVar47;
      *(ushort *)((long)d5_out + lVar5 + 0xc) = uVar51;
      *(ushort *)((long)d5_out + lVar5 + 0xe) = uVar55;
      uVar56 = *(ushort *)((long)d3_out + lVar5) & local_4b8;
      uVar57 = *(ushort *)((long)d3_out + lVar5 + 2) & uStack_4b6;
      uVar58 = *(ushort *)((long)d3_out + lVar5 + 4) & uStack_4b4;
      uVar59 = *(ushort *)((long)d3_out + lVar5 + 6) & uStack_4b2;
      uVar60 = *(ushort *)((long)d3_out + lVar5 + 8) & uStack_4b0;
      uVar61 = *(ushort *)((long)d3_out + lVar5 + 10) & uStack_4ae;
      uVar62 = *(ushort *)((long)d3_out + lVar5 + 0xc) & uStack_4ac;
      uVar63 = *(ushort *)((long)d3_out + lVar5 + 0xe) & uStack_4aa;
      *(ushort *)((long)d3_out + lVar5) = uVar56;
      *(ushort *)((long)d3_out + lVar5 + 2) = uVar57;
      *(ushort *)((long)d3_out + lVar5 + 4) = uVar58;
      *(ushort *)((long)d3_out + lVar5 + 6) = uVar59;
      *(ushort *)((long)d3_out + lVar5 + 8) = uVar60;
      *(ushort *)((long)d3_out + lVar5 + 10) = uVar61;
      *(ushort *)((long)d3_out + lVar5 + 0xc) = uVar62;
      *(ushort *)((long)d3_out + lVar5 + 0xe) = uVar63;
      *(ushort *)((long)&local_3f8 + lVar5) = uVar56 | uVar24;
      *(ushort *)((long)&local_3f8 + lVar5 + 2) = uVar57 | uVar30;
      *(ushort *)((long)&local_3f8 + lVar5 + 4) = uVar58 | uVar34;
      *(ushort *)((long)&local_3f8 + lVar5 + 6) = uVar59 | uVar38;
      *(ushort *)((long)&uStack_3f0 + lVar5) = uVar60 | uVar42;
      *(ushort *)((long)&uStack_3f0 + lVar5 + 2) = uVar61 | uVar47;
      *(ushort *)((long)&uStack_3f0 + lVar5 + 4) = uVar62 | uVar51;
      *(ushort *)((long)&uStack_3f0 + lVar5 + 6) = uVar63 | uVar55;
    }
    local_448 = (ushort)((sVar72 - (short)local_3e8) + sVar22) >> 3 & local_4b8 | local_448 & uVar10
    ;
    uStack_446 = (ushort)((sVar73 - local_3e8._2_2_) + sVar28) >> 3 & uStack_4b6 |
                 uStack_446 & uVar13;
    uStack_444 = (ushort)((sVar74 - local_3e8._4_2_) + sVar32) >> 3 & uStack_4b4 |
                 uStack_444 & uVar14;
    uStack_442 = (ushort)((sVar75 - local_3e8._6_2_) + sVar36) >> 3 & uStack_4b2 |
                 uStack_442 & uVar15;
    uStack_440 = (ushort)((sVar76 - sStack_3e0) + sVar40) >> 3 & uStack_4b0 | uStack_440 & uVar16;
    uStack_43e = (ushort)((sVar77 - sStack_3de) + sVar45) >> 3 & uStack_4ae | uStack_43e & uVar18;
    uStack_43c = (ushort)((sVar78 - sStack_3dc) + sVar49) >> 3 & uStack_4ac | uStack_43c & uVar19;
    uStack_43a = (ushort)((sVar79 - sStack_3da) + sVar53) >> 3 & uStack_4aa | uStack_43a & uVar20;
    local_3d8 = (ushort)(sVar23 + sVar21) >> 3 & local_4b8 | local_3d8 & uVar10;
    uStack_3d6 = (ushort)(sVar29 + sVar27) >> 3 & uStack_4b6 | uStack_3d6 & uVar13;
    uStack_3d4 = (ushort)(sVar33 + sVar31) >> 3 & uStack_4b4 | uStack_3d4 & uVar14;
    uStack_3d2 = (ushort)(sVar37 + sVar35) >> 3 & uStack_4b2 | uStack_3d2 & uVar15;
    uStack_3d0 = (ushort)(sVar41 + sVar39) >> 3 & uStack_4b0 | uStack_3d0 & uVar16;
    uStack_3ce = (ushort)(sVar46 + sVar44) >> 3 & uStack_4ae | uStack_3ce & uVar18;
    uStack_3cc = (ushort)(sVar50 + sVar48) >> 3 & uStack_4ac | uStack_3cc & uVar19;
    uStack_3ca = (ushort)(sVar54 + sVar52) >> 3 & uStack_4aa | uStack_3ca & uVar20;
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 0x10) {
      uVar24 = *(ushort *)((long)d4_out + lVar5) & uVar10;
      uVar30 = *(ushort *)((long)d4_out + lVar5 + 2) & uVar13;
      uVar34 = *(ushort *)((long)d4_out + lVar5 + 4) & uVar14;
      uVar38 = *(ushort *)((long)d4_out + lVar5 + 6) & uVar15;
      uVar42 = *(ushort *)((long)d4_out + lVar5 + 8) & uVar16;
      uVar47 = *(ushort *)((long)d4_out + lVar5 + 10) & uVar18;
      uVar51 = *(ushort *)((long)d4_out + lVar5 + 0xc) & uVar19;
      uVar55 = *(ushort *)((long)d4_out + lVar5 + 0xe) & uVar20;
      *(ushort *)((long)d4_out + lVar5) = uVar24;
      *(ushort *)((long)d4_out + lVar5 + 2) = uVar30;
      *(ushort *)((long)d4_out + lVar5 + 4) = uVar34;
      *(ushort *)((long)d4_out + lVar5 + 6) = uVar38;
      *(ushort *)((long)d4_out + lVar5 + 8) = uVar42;
      *(ushort *)((long)d4_out + lVar5 + 10) = uVar47;
      *(ushort *)((long)d4_out + lVar5 + 0xc) = uVar51;
      *(ushort *)((long)d4_out + lVar5 + 0xe) = uVar55;
      uVar56 = *(ushort *)((long)d2_out + lVar5) & local_4b8;
      uVar57 = *(ushort *)((long)d2_out + lVar5 + 2) & uStack_4b6;
      uVar58 = *(ushort *)((long)d2_out + lVar5 + 4) & uStack_4b4;
      uVar59 = *(ushort *)((long)d2_out + lVar5 + 6) & uStack_4b2;
      uVar60 = *(ushort *)((long)d2_out + lVar5 + 8) & uStack_4b0;
      uVar61 = *(ushort *)((long)d2_out + lVar5 + 10) & uStack_4ae;
      uVar62 = *(ushort *)((long)d2_out + lVar5 + 0xc) & uStack_4ac;
      uVar63 = *(ushort *)((long)d2_out + lVar5 + 0xe) & uStack_4aa;
      *(ushort *)((long)d2_out + lVar5) = uVar56;
      *(ushort *)((long)d2_out + lVar5 + 2) = uVar57;
      *(ushort *)((long)d2_out + lVar5 + 4) = uVar58;
      *(ushort *)((long)d2_out + lVar5 + 6) = uVar59;
      *(ushort *)((long)d2_out + lVar5 + 8) = uVar60;
      *(ushort *)((long)d2_out + lVar5 + 10) = uVar61;
      *(ushort *)((long)d2_out + lVar5 + 0xc) = uVar62;
      *(ushort *)((long)d2_out + lVar5 + 0xe) = uVar63;
      *(ushort *)((long)&local_468 + lVar5) = uVar56 | uVar24;
      *(ushort *)((long)&local_468 + lVar5 + 2) = uVar57 | uVar30;
      *(ushort *)((long)&local_468 + lVar5 + 4) = uVar58 | uVar34;
      *(ushort *)((long)&local_468 + lVar5 + 6) = uVar59 | uVar38;
      *(ushort *)((long)&uStack_460 + lVar5) = uVar60 | uVar42;
      *(ushort *)((long)&uStack_460 + lVar5 + 2) = uVar61 | uVar47;
      *(ushort *)((long)&uStack_460 + lVar5 + 4) = uVar62 | uVar51;
      *(ushort *)((long)&uStack_460 + lVar5 + 6) = uVar63 | uVar55;
      uVar24 = *(ushort *)((long)d5_out + lVar5) & uVar10;
      uVar30 = *(ushort *)((long)d5_out + lVar5 + 2) & uVar13;
      uVar34 = *(ushort *)((long)d5_out + lVar5 + 4) & uVar14;
      uVar38 = *(ushort *)((long)d5_out + lVar5 + 6) & uVar15;
      uVar42 = *(ushort *)((long)d5_out + lVar5 + 8) & uVar16;
      uVar47 = *(ushort *)((long)d5_out + lVar5 + 10) & uVar18;
      uVar51 = *(ushort *)((long)d5_out + lVar5 + 0xc) & uVar19;
      uVar55 = *(ushort *)((long)d5_out + lVar5 + 0xe) & uVar20;
      *(ushort *)((long)d5_out + lVar5) = uVar24;
      *(ushort *)((long)d5_out + lVar5 + 2) = uVar30;
      *(ushort *)((long)d5_out + lVar5 + 4) = uVar34;
      *(ushort *)((long)d5_out + lVar5 + 6) = uVar38;
      *(ushort *)((long)d5_out + lVar5 + 8) = uVar42;
      *(ushort *)((long)d5_out + lVar5 + 10) = uVar47;
      *(ushort *)((long)d5_out + lVar5 + 0xc) = uVar51;
      *(ushort *)((long)d5_out + lVar5 + 0xe) = uVar55;
      uVar56 = *(ushort *)((long)d3_out + lVar5) & local_4b8;
      uVar57 = *(ushort *)((long)d3_out + lVar5 + 2) & uStack_4b6;
      uVar58 = *(ushort *)((long)d3_out + lVar5 + 4) & uStack_4b4;
      uVar59 = *(ushort *)((long)d3_out + lVar5 + 6) & uStack_4b2;
      uVar60 = *(ushort *)((long)d3_out + lVar5 + 8) & uStack_4b0;
      uVar61 = *(ushort *)((long)d3_out + lVar5 + 10) & uStack_4ae;
      uVar62 = *(ushort *)((long)d3_out + lVar5 + 0xc) & uStack_4ac;
      uVar63 = *(ushort *)((long)d3_out + lVar5 + 0xe) & uStack_4aa;
      *(ushort *)((long)d3_out + lVar5) = uVar56;
      *(ushort *)((long)d3_out + lVar5 + 2) = uVar57;
      *(ushort *)((long)d3_out + lVar5 + 4) = uVar58;
      *(ushort *)((long)d3_out + lVar5 + 6) = uVar59;
      *(ushort *)((long)d3_out + lVar5 + 8) = uVar60;
      *(ushort *)((long)d3_out + lVar5 + 10) = uVar61;
      *(ushort *)((long)d3_out + lVar5 + 0xc) = uVar62;
      *(ushort *)((long)d3_out + lVar5 + 0xe) = uVar63;
      *(ushort *)((long)&local_3f8 + lVar5) = uVar56 | uVar24;
      *(ushort *)((long)&local_3f8 + lVar5 + 2) = uVar57 | uVar30;
      *(ushort *)((long)&local_3f8 + lVar5 + 4) = uVar58 | uVar34;
      *(ushort *)((long)&local_3f8 + lVar5 + 6) = uVar59 | uVar38;
      *(ushort *)((long)&uStack_3f0 + lVar5) = uVar60 | uVar42;
      *(ushort *)((long)&uStack_3f0 + lVar5 + 2) = uVar61 | uVar47;
      *(ushort *)((long)&uStack_3f0 + lVar5 + 4) = uVar62 | uVar51;
      *(ushort *)((long)&uStack_3f0 + lVar5 + 6) = uVar63 | uVar55;
    }
    if (uVar2 != 0) {
      for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 0x10) {
        uVar2 = *(ushort *)((long)&local_468 + lVar5);
        uVar10 = *(ushort *)((long)&local_468 + lVar5 + 2);
        uVar13 = *(ushort *)((long)&local_468 + lVar5 + 4);
        uVar14 = *(ushort *)((long)&local_468 + lVar5 + 6);
        uVar15 = *(ushort *)((long)&uStack_460 + lVar5);
        uVar16 = *(ushort *)((long)&uStack_460 + lVar5 + 2);
        uVar18 = *(ushort *)((long)&uStack_460 + lVar5 + 4);
        uVar19 = *(ushort *)((long)&uStack_460 + lVar5 + 6);
        uVar20 = *(ushort *)((long)d0_out + lVar5) & local_4c8;
        uVar24 = *(ushort *)((long)d0_out + lVar5 + 2) & uStack_4c6;
        uVar30 = *(ushort *)((long)d0_out + lVar5 + 4) & uStack_4c4;
        uVar34 = *(ushort *)((long)d0_out + lVar5 + 6) & uStack_4c2;
        uVar38 = *(ushort *)((long)d0_out + lVar5 + 8) & uStack_4c0;
        uVar42 = *(ushort *)((long)d0_out + lVar5 + 10) & uStack_4be;
        uVar47 = *(ushort *)((long)d0_out + lVar5 + 0xc) & uStack_4bc;
        uVar51 = *(ushort *)((long)d0_out + lVar5 + 0xe) & uStack_4ba;
        *(ushort *)((long)d0_out + lVar5) = uVar20;
        *(ushort *)((long)d0_out + lVar5 + 2) = uVar24;
        *(ushort *)((long)d0_out + lVar5 + 4) = uVar30;
        *(ushort *)((long)d0_out + lVar5 + 6) = uVar34;
        *(ushort *)((long)d0_out + lVar5 + 8) = uVar38;
        *(ushort *)((long)d0_out + lVar5 + 10) = uVar42;
        *(ushort *)((long)d0_out + lVar5 + 0xc) = uVar47;
        *(ushort *)((long)d0_out + lVar5 + 0xe) = uVar51;
        *(ushort *)((long)&local_468 + lVar5) = uVar20 | uVar2 & (local_4c8 ^ 0xffff);
        *(ushort *)((long)&local_468 + lVar5 + 2) = uVar24 | uVar10 & (uStack_4c6 ^ 0xffff);
        *(ushort *)((long)&local_468 + lVar5 + 4) = uVar30 | uVar13 & (uStack_4c4 ^ 0xffff);
        *(ushort *)((long)&local_468 + lVar5 + 6) = uVar34 | uVar14 & (uStack_4c2 ^ 0xffff);
        *(ushort *)((long)&uStack_460 + lVar5) = uVar38 | uVar15 & (uStack_4c0 ^ 0xffff);
        *(ushort *)((long)&uStack_460 + lVar5 + 2) = uVar42 | uVar16 & (uStack_4be ^ 0xffff);
        *(ushort *)((long)&uStack_460 + lVar5 + 4) = uVar47 | uVar18 & (uStack_4bc ^ 0xffff);
        *(ushort *)((long)&uStack_460 + lVar5 + 6) = uVar51 | uVar19 & (uStack_4ba ^ 0xffff);
        uVar2 = *(ushort *)((long)&local_3f8 + lVar5);
        uVar10 = *(ushort *)((long)&local_3f8 + lVar5 + 2);
        uVar13 = *(ushort *)((long)&local_3f8 + lVar5 + 4);
        uVar14 = *(ushort *)((long)&local_3f8 + lVar5 + 6);
        uVar15 = *(ushort *)((long)&uStack_3f0 + lVar5);
        uVar16 = *(ushort *)((long)&uStack_3f0 + lVar5 + 2);
        uVar18 = *(ushort *)((long)&uStack_3f0 + lVar5 + 4);
        uVar19 = *(ushort *)((long)&uStack_3f0 + lVar5 + 6);
        uVar20 = *(ushort *)((long)d1_out + lVar5) & local_4c8;
        uVar24 = *(ushort *)((long)d1_out + lVar5 + 2) & uStack_4c6;
        uVar30 = *(ushort *)((long)d1_out + lVar5 + 4) & uStack_4c4;
        uVar34 = *(ushort *)((long)d1_out + lVar5 + 6) & uStack_4c2;
        uVar38 = *(ushort *)((long)d1_out + lVar5 + 8) & uStack_4c0;
        uVar42 = *(ushort *)((long)d1_out + lVar5 + 10) & uStack_4be;
        uVar47 = *(ushort *)((long)d1_out + lVar5 + 0xc) & uStack_4bc;
        uVar51 = *(ushort *)((long)d1_out + lVar5 + 0xe) & uStack_4ba;
        *(ushort *)((long)d1_out + lVar5) = uVar20;
        *(ushort *)((long)d1_out + lVar5 + 2) = uVar24;
        *(ushort *)((long)d1_out + lVar5 + 4) = uVar30;
        *(ushort *)((long)d1_out + lVar5 + 6) = uVar34;
        *(ushort *)((long)d1_out + lVar5 + 8) = uVar38;
        *(ushort *)((long)d1_out + lVar5 + 10) = uVar42;
        *(ushort *)((long)d1_out + lVar5 + 0xc) = uVar47;
        *(ushort *)((long)d1_out + lVar5 + 0xe) = uVar51;
        *(ushort *)((long)&local_3f8 + lVar5) = uVar20 | uVar2 & (local_4c8 ^ 0xffff);
        *(ushort *)((long)&local_3f8 + lVar5 + 2) = uVar24 | uVar10 & (uStack_4c6 ^ 0xffff);
        *(ushort *)((long)&local_3f8 + lVar5 + 4) = uVar30 | uVar13 & (uStack_4c4 ^ 0xffff);
        *(ushort *)((long)&local_3f8 + lVar5 + 6) = uVar34 | uVar14 & (uStack_4c2 ^ 0xffff);
        *(ushort *)((long)&uStack_3f0 + lVar5) = uVar38 | uVar15 & (uStack_4c0 ^ 0xffff);
        *(ushort *)((long)&uStack_3f0 + lVar5 + 2) = uVar42 | uVar16 & (uStack_4be ^ 0xffff);
        *(ushort *)((long)&uStack_3f0 + lVar5 + 4) = uVar47 | uVar18 & (uStack_4bc ^ 0xffff);
        *(ushort *)((long)&uStack_3f0 + lVar5 + 6) = uVar51 | uVar19 & (uStack_4ba ^ 0xffff);
      }
    }
  }
  highbd_transpose8x8_sse2
            (&d0,&local_408,(__m128i *)&local_418,(__m128i *)&local_428,(__m128i *)&local_438,
             (__m128i *)&local_448,(__m128i *)&local_458,(__m128i *)&local_468,&d0_out,&d1_out,
             &d2_out,&d3_out,&d4_out,&d5_out,&d6_out,&d7_out);
  lVar7 = local_360;
  lVar5 = local_368;
  puVar1 = local_370;
  *(ulong *)(local_370 + -8) =
       CONCAT26(d0_out[0]._6_2_,
                CONCAT24(d0_out[0]._4_2_,CONCAT22(d0_out[0]._2_2_,(ushort)d0_out[0])));
  *(ulong *)(local_370 + -4) =
       CONCAT26(d0_out[1]._6_2_,
                CONCAT24(d0_out[1]._4_2_,CONCAT22(d0_out[1]._2_2_,(ushort)d0_out[1])));
  *(ulong *)(local_370 + local_360 + -8) =
       CONCAT26(d1_out[0]._6_2_,
                CONCAT24(d1_out[0]._4_2_,CONCAT22(d1_out[0]._2_2_,(ushort)d1_out[0])));
  *(ulong *)(local_370 + local_360 + -8 + 4) =
       CONCAT26(d1_out[1]._6_2_,
                CONCAT24(d1_out[1]._4_2_,CONCAT22(d1_out[1]._2_2_,(ushort)d1_out[1])));
  *(ulong *)(local_370 + lVar3 + -8) =
       CONCAT26(d2_out[0]._6_2_,
                CONCAT24(d2_out[0]._4_2_,CONCAT22(d2_out[0]._2_2_,(ushort)d2_out[0])));
  *(ulong *)(local_370 + lVar3 + -8 + 4) =
       CONCAT26(d2_out[1]._6_2_,
                CONCAT24(d2_out[1]._4_2_,CONCAT22(d2_out[1]._2_2_,(ushort)d2_out[1])));
  *(ulong *)(local_370 + lVar4 + -8) =
       CONCAT26(d3_out[0]._6_2_,
                CONCAT24(d3_out[0]._4_2_,CONCAT22(d3_out[0]._2_2_,(ushort)d3_out[0])));
  *(ulong *)(local_370 + lVar4 + -8 + 4) =
       CONCAT26(d3_out[1]._6_2_,
                CONCAT24(d3_out[1]._4_2_,CONCAT22(d3_out[1]._2_2_,(ushort)d3_out[1])));
  *(longlong *)(local_370 + local_368 + -8) = d4_out[0];
  *(longlong *)(local_370 + local_368 + -8 + 4) = d4_out[1];
  *(longlong *)(local_370 + lVar6 + -8) = d5_out[0];
  *(longlong *)(local_370 + lVar6 + -8 + 4) = d5_out[1];
  *(longlong *)(local_370 + lVar9 + -8) = d6_out[0];
  *(longlong *)(local_370 + lVar9 + -8 + 4) = d6_out[1];
  *(longlong *)(local_370 + lVar8 + -8) = d7_out[0];
  *(longlong *)(local_370 + lVar8 + -8 + 4) = d7_out[1];
  highbd_transpose8x8_sse2
            ((__m128i *)&local_3f8,(__m128i *)&local_3e8,(__m128i *)&local_3d8,(__m128i *)&local_3c8
             ,(__m128i *)&local_3b8,(__m128i *)&local_3a8,&local_398,&d7,&d0_out,&d1_out,&d2_out,
             &d3_out,&d4_out,&d5_out,&d6_out,&d7_out);
  *(ulong *)puVar1 =
       CONCAT26(d0_out[0]._6_2_,
                CONCAT24(d0_out[0]._4_2_,CONCAT22(d0_out[0]._2_2_,(ushort)d0_out[0])));
  *(ulong *)(puVar1 + 4) =
       CONCAT26(d0_out[1]._6_2_,
                CONCAT24(d0_out[1]._4_2_,CONCAT22(d0_out[1]._2_2_,(ushort)d0_out[1])));
  *(ulong *)(puVar1 + lVar7) =
       CONCAT26(d1_out[0]._6_2_,
                CONCAT24(d1_out[0]._4_2_,CONCAT22(d1_out[0]._2_2_,(ushort)d1_out[0])));
  *(ulong *)(puVar1 + lVar7 + 4) =
       CONCAT26(d1_out[1]._6_2_,
                CONCAT24(d1_out[1]._4_2_,CONCAT22(d1_out[1]._2_2_,(ushort)d1_out[1])));
  *(ulong *)(puVar1 + lVar3) =
       CONCAT26(d2_out[0]._6_2_,
                CONCAT24(d2_out[0]._4_2_,CONCAT22(d2_out[0]._2_2_,(ushort)d2_out[0])));
  *(ulong *)(puVar1 + lVar3 + 4) =
       CONCAT26(d2_out[1]._6_2_,
                CONCAT24(d2_out[1]._4_2_,CONCAT22(d2_out[1]._2_2_,(ushort)d2_out[1])));
  *(ulong *)(puVar1 + lVar4) =
       CONCAT26(d3_out[0]._6_2_,
                CONCAT24(d3_out[0]._4_2_,CONCAT22(d3_out[0]._2_2_,(ushort)d3_out[0])));
  *(ulong *)(puVar1 + lVar4 + 4) =
       CONCAT26(d3_out[1]._6_2_,
                CONCAT24(d3_out[1]._4_2_,CONCAT22(d3_out[1]._2_2_,(ushort)d3_out[1])));
  *(longlong *)(puVar1 + lVar5) = d4_out[0];
  *(longlong *)(puVar1 + lVar5 + 4) = d4_out[1];
  *(longlong *)(puVar1 + lVar6) = d5_out[0];
  *(longlong *)(puVar1 + lVar6 + 4) = d5_out[1];
  *(longlong *)(puVar1 + lVar9) = d6_out[0];
  *(longlong *)(puVar1 + lVar9 + 4) = d6_out[1];
  *(longlong *)(puVar1 + lVar8) = d7_out[0];
  *(longlong *)(puVar1 + lVar8 + 4) = d7_out[1];
  return;
}

Assistant:

void aom_highbd_lpf_vertical_14_dual_sse2(
    uint16_t *s, int pitch, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i q[7], p[7];
  __m128i p6, p5, p4, p3, p2, p1, p0, q0;
  __m128i p6_2, p5_2, p4_2, p3_2, p2_2, p1_2, q0_2, p0_2;
  __m128i d0, d7;
  __m128i d0_out, d1_out, d2_out, d3_out, d4_out, d5_out, d6_out, d7_out;

  p6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * pitch));
  p5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * pitch));
  p4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * pitch));
  p3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * pitch));
  p2 = _mm_loadu_si128((__m128i *)((s - 8) + 4 * pitch));
  p1 = _mm_loadu_si128((__m128i *)((s - 8) + 5 * pitch));
  p0 = _mm_loadu_si128((__m128i *)((s - 8) + 6 * pitch));
  q0 = _mm_loadu_si128((__m128i *)((s - 8) + 7 * pitch));

  highbd_transpose8x8_sse2(&p6, &p5, &p4, &p3, &p2, &p1, &p0, &q0, &d0, &p[6],
                           &p[5], &p[4], &p[3], &p[2], &p[1], &p[0]);

  p6_2 = _mm_loadu_si128((__m128i *)(s + 0 * pitch));
  p5_2 = _mm_loadu_si128((__m128i *)(s + 1 * pitch));
  p4_2 = _mm_loadu_si128((__m128i *)(s + 2 * pitch));
  p3_2 = _mm_loadu_si128((__m128i *)(s + 3 * pitch));
  p2_2 = _mm_loadu_si128((__m128i *)(s + 4 * pitch));
  p1_2 = _mm_loadu_si128((__m128i *)(s + 5 * pitch));
  p0_2 = _mm_loadu_si128((__m128i *)(s + 6 * pitch));
  q0_2 = _mm_loadu_si128((__m128i *)(s + 7 * pitch));

  highbd_transpose8x8_sse2(&p6_2, &p5_2, &p4_2, &p3_2, &p2_2, &p1_2, &p0_2,
                           &q0_2, &q[0], &q[1], &q[2], &q[3], &q[4], &q[5],
                           &q[6], &d7);

  highbd_lpf_internal_14_dual_sse2(p, q, blimit0, limit0, thresh0, blimit1,
                                   limit1, thresh1, bd);

  highbd_transpose8x8_sse2(&d0, &p[6], &p[5], &p[4], &p[3], &p[2], &p[1], &p[0],
                           &d0_out, &d1_out, &d2_out, &d3_out, &d4_out, &d5_out,
                           &d6_out, &d7_out);

  _mm_storeu_si128((__m128i *)(s - 8 + 0 * pitch), d0_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 1 * pitch), d1_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 2 * pitch), d2_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 3 * pitch), d3_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 4 * pitch), d4_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 5 * pitch), d5_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 6 * pitch), d6_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 7 * pitch), d7_out);

  highbd_transpose8x8_sse2(&q[0], &q[1], &q[2], &q[3], &q[4], &q[5], &q[6], &d7,
                           &d0_out, &d1_out, &d2_out, &d3_out, &d4_out, &d5_out,
                           &d6_out, &d7_out);

  _mm_storeu_si128((__m128i *)(s + 0 * pitch), d0_out);
  _mm_storeu_si128((__m128i *)(s + 1 * pitch), d1_out);
  _mm_storeu_si128((__m128i *)(s + 2 * pitch), d2_out);
  _mm_storeu_si128((__m128i *)(s + 3 * pitch), d3_out);
  _mm_storeu_si128((__m128i *)(s + 4 * pitch), d4_out);
  _mm_storeu_si128((__m128i *)(s + 5 * pitch), d5_out);
  _mm_storeu_si128((__m128i *)(s + 6 * pitch), d6_out);
  _mm_storeu_si128((__m128i *)(s + 7 * pitch), d7_out);
}